

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int decodeFlags(MemPage *pPage,int flagByte)

{
  BtShared *pBVar1;
  u8 uVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  uVar2 = (u8)((uint)flagByte >> 3);
  pPage->leaf = uVar2;
  pPage->childPtrSize = '\x04' - (char)(((uint)flagByte >> 3) << 2);
  pBVar1 = pPage->pBt;
  if ((flagByte & 0xfffffff7U) == 2) {
    pPage->intKey = '\0';
    pPage->intKeyLeaf = '\0';
    lVar3 = 0x2a;
    lVar4 = 0x28;
    bVar5 = false;
  }
  else {
    if ((flagByte & 0xfffffff7U) != 5) {
      sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xd4f9,
                  "8a8ffc862e96f57aa698f93de10dee28e69f6e09");
      return 0xb;
    }
    pPage->intKey = '\x01';
    pPage->intKeyLeaf = uVar2;
    bVar5 = uVar2 == '\0';
    lVar3 = 0x2e;
    lVar4 = 0x2c;
  }
  pPage->noPayload = bVar5;
  pPage->maxLocal = *(u16 *)((long)&pBVar1->pPager + lVar4);
  pPage->minLocal = *(u16 *)((long)&pBVar1->pPager + lVar3);
  pPage->max1bytePayload = pBVar1->max1bytePayload;
  return 0;
}

Assistant:

static int decodeFlags(MemPage *pPage, int flagByte){
  BtShared *pBt;     /* A copy of pPage->pBt */

  assert( pPage->hdrOffset==(pPage->pgno==1 ? 100 : 0) );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  pPage->leaf = (u8)(flagByte>>3);  assert( PTF_LEAF == 1<<3 );
  flagByte &= ~PTF_LEAF;
  pPage->childPtrSize = 4-4*pPage->leaf;
  pBt = pPage->pBt;
  if( flagByte==(PTF_LEAFDATA | PTF_INTKEY) ){
    /* EVIDENCE-OF: R-03640-13415 A value of 5 means the page is an interior
    ** table b-tree page. */
    assert( (PTF_LEAFDATA|PTF_INTKEY)==5 );
    /* EVIDENCE-OF: R-20501-61796 A value of 13 means the page is a leaf
    ** table b-tree page. */
    assert( (PTF_LEAFDATA|PTF_INTKEY|PTF_LEAF)==13 );
    pPage->intKey = 1;
    pPage->intKeyLeaf = pPage->leaf;
    pPage->noPayload = !pPage->leaf;
    pPage->maxLocal = pBt->maxLeaf;
    pPage->minLocal = pBt->minLeaf;
  }else if( flagByte==PTF_ZERODATA ){
    /* EVIDENCE-OF: R-27225-53936 A value of 2 means the page is an interior
    ** index b-tree page. */
    assert( (PTF_ZERODATA)==2 );
    /* EVIDENCE-OF: R-16571-11615 A value of 10 means the page is a leaf
    ** index b-tree page. */
    assert( (PTF_ZERODATA|PTF_LEAF)==10 );
    pPage->intKey = 0;
    pPage->intKeyLeaf = 0;
    pPage->noPayload = 0;
    pPage->maxLocal = pBt->maxLocal;
    pPage->minLocal = pBt->minLocal;
  }else{
    /* EVIDENCE-OF: R-47608-56469 Any other value for the b-tree page type is
    ** an error. */
    return SQLITE_CORRUPT_BKPT;
  }
  pPage->max1bytePayload = pBt->max1bytePayload;
  return SQLITE_OK;
}